

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::layout_for_member_abi_cxx11_
          (CompilerHLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  allocator local_46;
  allocator local_45 [16];
  allocator local_35;
  uint32_t local_34;
  Bitset *local_30;
  Bitset *flags;
  long lStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  lStack_20 = CONCAT44(in_register_00000014,index);
  flags._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  local_34 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)(lStack_20 + 8));
  local_30 = Compiler::get_member_decoration_bitset((Compiler *)type,(TypeID)local_34,flags._4_4_);
  bVar1 = Bitset::get(local_30,5);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"row_major ",&local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else {
    bVar1 = Bitset::get(local_30,4);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"column_major ",local_45);
      ::std::allocator<char>::~allocator((allocator<char> *)local_45);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_46);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_46);
    }
  }
  return this;
}

Assistant:

string CompilerHLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	auto &flags = get_member_decoration_bitset(type.self, index);

	// HLSL can emit row_major or column_major decoration in any struct.
	// Do not try to merge combined decorations for children like in GLSL.

	// Flip the convention. HLSL is a bit odd in that the memory layout is column major ... but the language API is "row-major".
	// The way to deal with this is to multiply everything in inverse order, and reverse the memory layout.
	if (flags.get(DecorationColMajor))
		return "row_major ";
	else if (flags.get(DecorationRowMajor))
		return "column_major ";

	return "";
}